

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testRunEnded(XmlReporter *this,TestRunStats *testRunStats)

{
  XmlFormatting fmt;
  ScopedElement *pSVar1;
  StringRef SVar2;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [32];
  StringRef local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_80;
  StringRef local_70;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [24];
  TestRunStats *testRunStats_local;
  XmlReporter *this_local;
  
  local_28._16_8_ = testRunStats;
  testRunStats_local = (TestRunStats *)this;
  StreamingReporterBase::testRunEnded(&this->super_StreamingReporterBase,testRunStats);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"OverallResults",&local_49);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->m_xml,(XmlFormatting)local_48);
  local_70 = operator____sr("successes",9);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                     ((ScopedElement *)local_28,local_70,(unsigned_long *)(local_28._16_8_ + 0x10));
  local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
              )operator____sr("failures",8);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                     (pSVar1,(StringRef)local_80,
                      &(((Totals *)(local_28._16_8_ + 0x10))->assertions).failed);
  local_90 = operator____sr("expectedFailures",0x10);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                     (pSVar1,local_90,
                      &(((Totals *)(local_28._16_8_ + 0x10))->assertions).failedButOk);
  local_b0._16_16_ = (undefined1  [16])operator____sr("skips",5);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
            (pSVar1,(StringRef)local_b0._16_16_,
             &(((Totals *)(local_28._16_8_ + 0x10))->assertions).skipped);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"OverallResultsCases",&local_d1);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_b0,(string *)&this->m_xml,(XmlFormatting)local_d0);
  SVar2 = operator____sr("successes",9);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                     ((ScopedElement *)local_b0,SVar2,
                      &(((Totals *)(local_28._16_8_ + 0x10))->testCases).passed);
  SVar2 = operator____sr("failures",8);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                     (pSVar1,SVar2,&(((Totals *)(local_28._16_8_ + 0x10))->testCases).failed);
  SVar2 = operator____sr("expectedFailures",0x10);
  pSVar1 = XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
                     (pSVar1,SVar2,&(((Totals *)(local_28._16_8_ + 0x10))->testCases).failedButOk);
  SVar2 = operator____sr("skips",5);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
            (pSVar1,SVar2,&(((Totals *)(local_28._16_8_ + 0x10))->testCases).skipped);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b0);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  fmt = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,fmt);
  return;
}

Assistant:

void XmlReporter::testRunEnded( TestRunStats const& testRunStats ) {
        StreamingReporterBase::testRunEnded( testRunStats );
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes"_sr, testRunStats.totals.assertions.passed )
            .writeAttribute( "failures"_sr, testRunStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures"_sr, testRunStats.totals.assertions.failedButOk )
            .writeAttribute( "skips"_sr, testRunStats.totals.assertions.skipped );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes"_sr, testRunStats.totals.testCases.passed )
            .writeAttribute( "failures"_sr, testRunStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures"_sr, testRunStats.totals.testCases.failedButOk )
            .writeAttribute( "skips"_sr, testRunStats.totals.testCases.skipped );
        m_xml.endElement();
    }